

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O3

void SplittingStepCoefficients_Write(SplittingStepCoefficients coefficients,FILE *outfile)

{
  sunrealtype **ppsVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  if ((((coefficients != (SplittingStepCoefficients)0x0 && outfile != (FILE *)0x0) &&
       (coefficients->alpha != (sunrealtype *)0x0)) && (coefficients->beta != (sunrealtype ***)0x0))
     && ((ppsVar1 = *coefficients->beta, ppsVar1 != (sunrealtype **)0x0 &&
         (*ppsVar1 != (sunrealtype *)0x0)))) {
    fprintf((FILE *)outfile,"  sequential methods = %i\n",
            (ulong)(uint)coefficients->sequential_methods);
    fprintf((FILE *)outfile,"  stages = %i\n",(ulong)(uint)coefficients->stages);
    fprintf((FILE *)outfile,"  partitions = %i\n",(ulong)(uint)coefficients->partitions);
    fprintf((FILE *)outfile,"  order = %i\n",(ulong)(uint)coefficients->order);
    fwrite("  alpha = ",10,1,(FILE *)outfile);
    if (0 < coefficients->sequential_methods) {
      lVar4 = 0;
      do {
        fprintf((FILE *)outfile,"% .15e  ",coefficients->alpha[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < coefficients->sequential_methods);
    }
    fputc(10,(FILE *)outfile);
    if (0 < coefficients->sequential_methods) {
      uVar3 = 0;
      do {
        fprintf((FILE *)outfile,"  beta[%i] = \n",uVar3 & 0xffffffff);
        if (-1 < coefficients->stages) {
          lVar4 = 0;
          do {
            fwrite("      ",6,1,(FILE *)outfile);
            if (0 < coefficients->partitions) {
              lVar5 = 0;
              do {
                fprintf((FILE *)outfile,"% .15e  ",coefficients->beta[uVar3][lVar4][lVar5]);
                lVar5 = lVar5 + 1;
              } while (lVar5 < coefficients->partitions);
            }
            fputc(10,(FILE *)outfile);
            bVar2 = lVar4 < coefficients->stages;
            lVar4 = lVar4 + 1;
          } while (bVar2);
        }
        fputc(10,(FILE *)outfile);
        uVar3 = uVar3 + 1;
      } while ((long)uVar3 < (long)coefficients->sequential_methods);
    }
  }
  return;
}

Assistant:

void SplittingStepCoefficients_Write(const SplittingStepCoefficients coefficients,
                                     FILE* const outfile)
{
  // TODO(SBR): update when https://github.com/LLNL/sundials/pull/517 merged
  if (outfile == NULL || coefficients == NULL || coefficients->alpha == NULL ||
      coefficients->beta == NULL || coefficients->beta[0] == NULL ||
      coefficients->beta[0][0] == NULL)
  {
    return;
  }

  fprintf(outfile, "  sequential methods = %i\n",
          coefficients->sequential_methods);
  fprintf(outfile, "  stages = %i\n", coefficients->stages);
  fprintf(outfile, "  partitions = %i\n", coefficients->partitions);
  fprintf(outfile, "  order = %i\n", coefficients->order);
  fprintf(outfile, "  alpha = ");
  for (int i = 0; i < coefficients->sequential_methods; i++)
  {
    fprintf(outfile, SUN_FORMAT_E "  ", coefficients->alpha[i]);
  }
  fprintf(outfile, "\n");

  for (int i = 0; i < coefficients->sequential_methods; i++)
  {
    fprintf(outfile, "  beta[%i] = \n", i);
    for (int j = 0; j <= coefficients->stages; j++)
    {
      fprintf(outfile, "      ");
      for (int k = 0; k < coefficients->partitions; k++)
      {
        fprintf(outfile, SUN_FORMAT_E "  ", coefficients->beta[i][j][k]);
      }
      fprintf(outfile, "\n");
    }
    fprintf(outfile, "\n");
  }
}